

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O1

PolymorphicEmitInfo __thiscall
Wasm::WasmBytecodeGenerator::EmitCall<(Wasm::WasmOp)16>(WasmBytecodeGenerator *this)

{
  TypedRegisterAllocator *this_00;
  uint index;
  IWasmByteCodeWriter *pIVar1;
  code *pcVar2;
  Type tmpReg;
  bool bVar3;
  bool bVar4;
  ArgSlot AVar5;
  uint16 uVar6;
  ArgSlot AVar7;
  BOOL BVar8;
  Local LVar9;
  uint uVar10;
  uint uVar11;
  RegSlot RVar12;
  EmitInfoBase EVar13;
  AsmJsRetType AVar14;
  WasmBinaryReader *pWVar15;
  undefined4 *puVar16;
  WasmFunctionInfo *pWVar17;
  EmitInfo EVar18;
  RegisterSpace *pRVar19;
  WasmRegisterSpace *pWVar20;
  EmitInfo EVar21;
  WasmCompilationException *this_01;
  WasmBinaryReader *pWVar22;
  EmitInfo *pEVar23;
  ushort uVar24;
  ulong count;
  long lVar25;
  ulong uVar26;
  uint uVar27;
  uint uVar28;
  WasmType WVar29;
  ProfileId PVar30;
  uint uVar31;
  uint32 uVar32;
  ulong uVar33;
  PolymorphicEmitInfo PVar34;
  EmitInfo local_a8;
  EmitInfo indirectIndexInfo;
  undefined1 local_80 [8];
  PolymorphicEmitInfo retInfo;
  EmitInfo *local_58;
  ushort local_3a;
  Type local_38;
  ArgSlot args;
  anon_class_1_0_00000001 argOverflow;
  
  local_a8.super_EmitInfoBase.location = 0xffffffff;
  local_a8.type = Void;
  pWVar15 = (WasmBinaryReader *)(this->m_funcInfo->m_customReader).ptr;
  pWVar22 = pWVar15;
  if (pWVar15 == (WasmBinaryReader *)0x0) {
    pWVar22 = (this->m_module->m_reader).ptr;
  }
  local_38 = (pWVar22->super_WasmReaderBase).m_currentNode.field_1.call.funcType;
  if (local_38 != Import) {
    pWVar22 = pWVar15;
    if (pWVar15 == (WasmBinaryReader *)0x0) {
      pWVar22 = (this->m_module->m_reader).ptr;
    }
    if ((pWVar22->super_WasmReaderBase).m_currentNode.field_1.call.funcType != Function) {
      if (pWVar15 == (WasmBinaryReader *)0x0) {
        pWVar15 = (this->m_module->m_reader).ptr;
      }
      if ((pWVar15->super_WasmReaderBase).m_currentNode.field_1.call.funcType != ImportThunk) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar16 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/WasmByteCodeGenerator.cpp"
                           ,0x449,
                           "(isImportCall || GetReader()->m_currentNode.call.funcType == FunctionIndexTypes::Function || GetReader()->m_currentNode.call.funcType == FunctionIndexTypes::ImportThunk)"
                           ,
                           "isImportCall || GetReader()->m_currentNode.call.funcType == FunctionIndexTypes::Function || GetReader()->m_currentNode.call.funcType == FunctionIndexTypes::ImportThunk"
                          );
        if (!bVar3) goto LAB_00f372aa;
        *puVar16 = 0;
      }
    }
  }
  pWVar15 = (WasmBinaryReader *)(this->m_funcInfo->m_customReader).ptr;
  if (pWVar15 == (WasmBinaryReader *)0x0) {
    pWVar15 = (this->m_module->m_reader).ptr;
  }
  index = (pWVar15->super_WasmReaderBase).m_currentNode.field_1.brTable.numTargets;
  pWVar17 = Js::WebAssemblyModule::GetWasmFunctionInfo(this->m_module,index);
  pWVar15 = (WasmBinaryReader *)(this->m_funcInfo->m_customReader).ptr;
  if (pWVar15 == (WasmBinaryReader *)0x0) {
    pWVar15 = (this->m_module->m_reader).ptr;
  }
  EVar21 = (EmitInfo)(pWVar17->m_signature).ptr;
  PVar30 = 0xffff;
  if (((pWVar15->super_WasmReaderBase).m_currentNode.field_1.call.funcType == Function) &&
     (bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_015cd718,WasmInOutPhase), !bVar3)) {
    PVar30 = this->currentProfileId;
    this->currentProfileId = PVar30 + 1;
    if ((ProfileId)(PVar30 + 1) == 0) goto LAB_00f37232;
  }
  if (local_38 == Import) {
    AVar5 = WasmSignature::GetParamCount((WasmSignature *)EVar21);
    uVar6 = UInt16Math::
            Mul<Wasm::WasmBytecodeGenerator::EmitCall<(Wasm::WasmOp)16>()::_lambda()_1_const>
                      (AVar5,8,(anon_class_1_0_00000001 *)((long)&args + 1));
    uVar24 = 0x11;
  }
  else {
    uVar6 = WasmSignature::GetParamsSize((WasmSignature *)EVar21);
    uVar24 = 0x1c;
  }
  uVar6 = UInt16Math::
          Add<Wasm::WasmBytecodeGenerator::EmitCall<(Wasm::WasmOp)16>()::_lambda()_1_const>
                    (uVar6,8,(anon_class_1_0_00000001 *)((long)&args + 1));
  if ((uVar6 & 7) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar16 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/WasmByteCodeGenerator.cpp"
                       ,0x478,"((0))","Wasm argument size should always be Var aligned");
    if (!bVar3) {
LAB_00f372aa:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar16 = 0;
    this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException(this_01,L"Internal Error");
    goto LAB_00f3721c;
  }
  (*this->m_writer->_vptr_IWasmByteCodeWriter[0x1f])(this->m_writer,(ulong)uVar24,(ulong)uVar6,0);
  AVar5 = WasmSignature::GetParamCount((WasmSignature *)EVar21);
  retInfo.field_1.infos = (EmitInfo *)&this->m_alloc;
  count = (ulong)AVar5;
  if (AVar5 == 0) {
    local_58 = (EmitInfo *)&DAT_00000008;
  }
  else {
    BVar8 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar8 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar16 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                         "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar3) goto LAB_00f372aa;
      *puVar16 = 0;
    }
    local_58 = (EmitInfo *)
               Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
               AllocInternal(retInfo.field_1.infos,(ulong)((uint)AVar5 * 8));
    if (local_58 == (EmitInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar16 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar3) goto LAB_00f372aa;
      *puVar16 = 0;
    }
    pEVar23 = local_58;
    do {
      pEVar23->super_EmitInfoBase = 0xffffffff;
      pEVar23->type = Void;
      pEVar23 = pEVar23 + 1;
    } while (pEVar23 != local_58 + count);
  }
  if (count != 0) {
    lVar25 = count + 1;
    do {
      LVar9 = WasmSignature::GetParam((WasmSignature *)EVar21,(short)lVar25 - 2);
      EVar18 = PopEvalStack(this,LVar9,L"Call argument does not match formal type");
      local_58[lVar25 + -2] = EVar18;
      lVar25 = lVar25 + -1;
    } while (1 < lVar25);
    puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    bVar3 = local_38 == Import;
    uVar31 = 0x21;
    if (bVar3) {
      uVar31 = 0x15;
    }
    uVar27 = 0x20;
    if (bVar3) {
      uVar27 = 0x14;
    }
    uVar28 = 0x22;
    if (bVar3) {
      uVar28 = 0x16;
    }
    uVar33 = 1;
    uVar26 = 0;
    indirectIndexInfo = EVar21;
    do {
      WVar29 = local_58[uVar26].type;
      if (7 < WVar29 - FirstLocalType) {
switchD_00f36cbb_caseD_6:
        WasmTypes::
        CompileAssertCasesNoFailFast<(Wasm::WasmTypes::WasmType)1,(Wasm::WasmTypes::WasmType)2,(Wasm::WasmTypes::WasmType)3,(Wasm::WasmTypes::WasmType)4,(Wasm::WasmTypes::WasmType)5>
                  ();
        this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
        WasmCompilationException::WasmCompilationException
                  (this_01,L"Unknown argument type %u",(ulong)WVar29);
        goto LAB_00f3721c;
      }
      uVar11 = local_58[uVar26].super_EmitInfoBase.location;
      uVar10 = uVar28;
      switch(WVar29) {
      case FirstLocalType:
        uVar10 = uVar27;
        break;
      case I64:
        uVar10 = uVar31;
        break;
      case F32:
        break;
      case F64:
        uVar10 = (uint)!bVar3 * 8 + 0x17;
        break;
      case V128:
        Simd::EnsureSimdIsEnabled();
        uVar10 = bVar3 ^ 0x145;
        break;
      default:
        goto switchD_00f36cbb_caseD_6;
      case Any:
        if (this->isUnreachable == false) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar16 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/WasmByteCodeGenerator.cpp"
                             ,0x4a6,"(IsUnreachable())","IsUnreachable()");
          if (!bVar4) goto LAB_00f372aa;
          *puVar16 = 0;
          EVar21 = indirectIndexInfo;
        }
        uVar10 = 0x14;
        if (this->isUnreachable == false) goto switchD_00f36cbb_caseD_6;
      }
      (*this->m_writer->_vptr_IWasmByteCodeWriter[0xf])
                (this->m_writer,(ulong)uVar10,uVar33,(ulong)uVar11);
      uVar11 = 1;
      if (local_38 != Import) {
        AVar7 = WasmSignature::GetParamSize((WasmSignature *)EVar21,(ArgSlot)uVar26);
        if ((AVar7 & 7) != 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar16 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/WasmByteCodeGenerator.cpp"
                             ,0x4bc,
                             "(Math::IsAligned<Js::ArgSlot>(currentArgSize, sizeof(Js::Var)))",
                             "Math::IsAligned<Js::ArgSlot>(currentArgSize, sizeof(Js::Var))");
          if (!bVar4) goto LAB_00f372aa;
          *puVar16 = 0;
          EVar21 = indirectIndexInfo;
        }
        uVar11 = (uint)(AVar7 >> 3);
      }
      uVar33 = (ulong)((int)uVar33 + uVar11);
      uVar26 = uVar26 + 1;
    } while (count != uVar26);
  }
  this_00 = &this->mTypedRegisterAllocator;
  uVar31 = 1;
  pRVar19 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace(this_00,INT64);
  RVar12 = WAsmJs::RegisterSpace::AcquireTmpRegister(pRVar19);
  if (local_38 != Import) {
    uVar31 = this->m_module->m_importedFunctionCount + 1;
  }
  if (CARRY4(uVar31,index)) {
LAB_00f37232:
    Math::DefaultOverflowPolicy();
  }
  (*this->m_writer->_vptr_IWasmByteCodeWriter[0x18])
            (this->m_writer,0x4e,(ulong)RVar12,1,(ulong)(uVar31 + index));
  local_80._0_4_ = 0;
  retInfo.count = 0;
  retInfo._4_4_ = 0;
  PolymorphicEmitInfo::Init
            ((PolymorphicEmitInfo *)local_80,*(Type *)((long)EVar21 + 4),
             (ArenaAllocator *)retInfo.field_1.infos);
  if (*(Type *)((long)EVar21 + 4) != 0) {
    uVar32 = 0;
    do {
      LVar9 = WasmSignature::GetResult((WasmSignature *)EVar21,uVar32);
      PolymorphicEmitInfo::SetInfo
                ((PolymorphicEmitInfo *)local_80,(EmitInfo)(((ulong)LVar9 << 0x20) + 0xffffffff),
                 uVar32);
      uVar32 = uVar32 + 1;
    } while (uVar32 < *(Type *)((long)EVar21 + 4));
  }
  if (local_38 != Import) {
    pRVar19 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace(this_00,INT64);
    WAsmJs::RegisterSpace::ReleaseTmpRegister(pRVar19,RVar12);
    ReleaseLocation(this,&local_a8);
    if (count != 0) {
      uVar26 = (ulong)((uint)AVar5 * 8);
      do {
        ReleaseLocation(this,(EmitInfo *)((long)&local_58[-1].super_EmitInfoBase.location + uVar26))
        ;
        uVar26 = uVar26 - 8;
      } while (uVar26 != 0);
    }
    if (*(Type *)((long)EVar21 + 4) != 0) {
      uVar32 = 0;
      do {
        LVar9 = WasmSignature::GetResult((WasmSignature *)EVar21,uVar32);
        pWVar20 = GetRegisterSpace(this,LVar9);
        EVar13.location = WAsmJs::RegisterSpace::AcquireTmpRegister(pWVar20);
        EVar18.type = LVar9;
        EVar18.super_EmitInfoBase.location = EVar13.location;
        PolymorphicEmitInfo::SetInfo((PolymorphicEmitInfo *)local_80,EVar18,uVar32);
        uVar32 = uVar32 + 1;
      } while (uVar32 < *(Type *)((long)EVar21 + 4));
    }
    if (local_80._0_4_ == 0) {
      WVar29 = Void;
      EVar21.super_EmitInfoBase.location = 0xffffffff;
      EVar21.type = Void;
    }
    else {
      EVar21 = PolymorphicEmitInfo::GetInfo((PolymorphicEmitInfo *)local_80,0);
      WVar29 = EVar21.type;
    }
    pIVar1 = this->m_writer;
    local_3a = uVar6 >> 3;
    AVar14 = WasmToAsmJs::GetAsmJsReturnType(WVar29);
    (*pIVar1->_vptr_IWasmByteCodeWriter[0x20])
              (pIVar1,0x1d,(ulong)EVar21 & 0xffffffff,(ulong)RVar12,(ulong)(uVar6 >> 3),
               (ulong)AVar14.which_,(uint)PVar30);
    goto LAB_00f371b7;
  }
  local_3a = WasmSignature::GetParamCount((WasmSignature *)EVar21);
  UInt16Math::Inc<Wasm::WasmBytecodeGenerator::EmitCall<(Wasm::WasmOp)16>()::_lambda()_1_const>
            (&local_3a,(anon_class_1_0_00000001 *)((long)&args + 1));
  pRVar19 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace(this_00,INT64);
  local_38 = WAsmJs::RegisterSpace::AcquireTmpRegister(pRVar19);
  if (1 < *(Type *)((long)EVar21 + 4)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar16 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/WasmByteCodeGenerator.cpp"
                       ,0x4e8,"(calleeSignature->GetResultCount() <= 1)",
                       "Multiple results from function imports not supported");
    if (!bVar3) goto LAB_00f372aa;
    *puVar16 = 0;
  }
  if (*(Type *)((long)EVar21 + 4) == 0) {
    uVar26 = 0;
  }
  else {
    LVar9 = WasmSignature::GetResult((WasmSignature *)EVar21,0);
    uVar26 = (ulong)LVar9;
  }
  pIVar1 = this->m_writer;
  uVar33 = (ulong)local_3a;
  WVar29 = (WasmType)uVar26;
  AVar14 = WasmToAsmJs::GetAsmJsReturnType(WVar29);
  tmpReg = local_38;
  (*pIVar1->_vptr_IWasmByteCodeWriter[0x20])
            (pIVar1,0x12,(ulong)(uint)local_38,(ulong)RVar12,uVar33,(ulong)AVar14.which_,
             (uint)PVar30);
  pRVar19 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace(this_00,INT64);
  WAsmJs::RegisterSpace::ReleaseTmpRegister(pRVar19,tmpReg);
  pRVar19 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace(this_00,INT64);
  WAsmJs::RegisterSpace::ReleaseTmpRegister(pRVar19,RVar12);
  ReleaseLocation(this,&local_a8);
  if (count != 0) {
    uVar33 = (ulong)((uint)AVar5 * 8);
    do {
      ReleaseLocation(this,(EmitInfo *)((long)&local_58[-1].super_EmitInfoBase.location + uVar33));
      uVar33 = uVar33 - 8;
    } while (uVar33 != 0);
  }
  if (*(Type *)((long)EVar21 + 4) == 0) goto LAB_00f371b7;
  switch(WVar29) {
  case FirstLocalType:
    uVar24 = 0x18;
    break;
  case I64:
    uVar24 = 0x1b;
    break;
  case F32:
    uVar24 = 0x19;
    break;
  case F64:
    uVar24 = 0x1a;
    break;
  case V128:
    this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (this_01,L"Return type: v128 not supported in import calls");
    goto LAB_00f3721c;
  default:
    WasmTypes::
    CompileAssertCasesNoFailFast<(Wasm::WasmTypes::WasmType)1,(Wasm::WasmTypes::WasmType)2,(Wasm::WasmTypes::WasmType)3,(Wasm::WasmTypes::WasmType)4,(Wasm::WasmTypes::WasmType)5>
              ();
    this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (this_01,L"Unknown call return type %u",uVar26);
LAB_00f3721c:
    __cxa_throw(this_01,&WasmCompilationException::typeinfo,
                WasmCompilationException::~WasmCompilationException);
  }
  pWVar20 = GetRegisterSpace(this,WVar29);
  RVar12 = WAsmJs::RegisterSpace::AcquireTmpRegister(pWVar20);
  PolymorphicEmitInfo::SetInfo
            ((PolymorphicEmitInfo *)local_80,(EmitInfo)((ulong)RVar12 | uVar26 << 0x20),0);
  (*this->m_writer->_vptr_IWasmByteCodeWriter[0xf])
            (this->m_writer,(ulong)uVar24,(ulong)RVar12,(ulong)(uint)local_38);
LAB_00f371b7:
  Memory::DeleteArray<Memory::ArenaAllocator,Wasm::EmitInfo>
            ((AllocatorType *)retInfo.field_1.infos,count,local_58);
  if (this->m_maxArgOutDepth <= (uint)local_3a) {
    this->m_maxArgOutDepth = local_3a + 1;
  }
  PVar34._4_4_ = 0;
  PVar34.count = local_80._0_4_;
  PVar34.field_1 = (anon_union_8_2_2e7736b0_for_PolymorphicEmitInfo_1)retInfo._0_8_;
  return PVar34;
}

Assistant:

PolymorphicEmitInfo WasmBytecodeGenerator::EmitCall()
{
    uint32 funcNum = Js::Constants::UninitializedValue;
    uint32 signatureId = Js::Constants::UninitializedValue;
    WasmSignature* calleeSignature = nullptr;
    Js::ProfileId profileId = Js::Constants::NoProfileId;
    EmitInfo indirectIndexInfo;
    const bool isImportCall = GetReader()->m_currentNode.call.funcType == FunctionIndexTypes::Import;
    Assert(isImportCall || GetReader()->m_currentNode.call.funcType == FunctionIndexTypes::Function || GetReader()->m_currentNode.call.funcType == FunctionIndexTypes::ImportThunk);
    switch (wasmOp)
    {
    case wbCall:
    {
        funcNum = GetReader()->m_currentNode.call.num;
        WasmFunctionInfo* calleeInfo = m_module->GetWasmFunctionInfo(funcNum);
        calleeSignature = calleeInfo->GetSignature();
        // currently only handle inlining internal function calls
        // in future we can expand to all calls by adding checks in inliner and falling back to call in case ScriptFunction doesn't match
        if (GetReader()->m_currentNode.call.funcType == FunctionIndexTypes::Function && !PHASE_TRACE1(Js::WasmInOutPhase))
        {
            profileId = GetNextProfileId();
        }
        break;
    }
    case wbCallIndirect:
        indirectIndexInfo = PopEvalStack(WasmTypes::I32, _u("Indirect call index must be int type"));
        signatureId = GetReader()->m_currentNode.call.num;
        calleeSignature = m_module->GetSignature(signatureId);
        break;
    default:
        Assume(UNREACHED);
    }

    const auto argOverflow = []
    {
        throw WasmCompilationException(_u("Argument size too big"));
    };

    // emit start call
    Js::ArgSlot argSize;
    Js::OpCodeAsmJs startCallOp;
    if (isImportCall)
    {
        argSize = ArgSlotMath::Mul(calleeSignature->GetParamCount(), sizeof(Js::Var), argOverflow);
        startCallOp = Js::OpCodeAsmJs::StartCall;
    }
    else
    {
        startCallOp = Js::OpCodeAsmJs::I_StartCall;
        argSize = calleeSignature->GetParamsSize();
    }
    // Add return value
    argSize = ArgSlotMath::Add(argSize, sizeof(Js::Var), argOverflow);
    if (!Math::IsAligned<Js::ArgSlot>(argSize, sizeof(Js::Var)))
    {
        AssertMsg(UNREACHED, "Wasm argument size should always be Var aligned");
        throw WasmCompilationException(_u("Internal Error"));
    }

    m_writer->AsmStartCall(startCallOp, argSize);

    Js::ArgSlot nArgs = calleeSignature->GetParamCount();

    // copy args into a list so they could be generated in the right order (FIFO)
    EmitInfo* argsList = AnewArray(&m_alloc, EmitInfo, nArgs);
    for (int i = int(nArgs) - 1; i >= 0; --i)
    {
        EmitInfo info = PopEvalStack(calleeSignature->GetParam((Js::ArgSlot)i), _u("Call argument does not match formal type"));
        // We can release the location of the arguments now, because we won't create new temps between start/call
        argsList[i] = info;
    }

    // Skip the this pointer (aka undefined)
    uint32 argLoc = 1;
    for (Js::ArgSlot i = 0; i < nArgs; ++i)
    {
        EmitInfo info = argsList[i];

        Js::OpCodeAsmJs argOp = Js::OpCodeAsmJs::Nop;
        switch (info.type)
        {
        case WasmTypes::F32:
            argOp = isImportCall ? Js::OpCodeAsmJs::ArgOut_Flt : Js::OpCodeAsmJs::I_ArgOut_Flt;
            break;
        case WasmTypes::F64:
            argOp = isImportCall ? Js::OpCodeAsmJs::ArgOut_Db : Js::OpCodeAsmJs::I_ArgOut_Db;
            break;
        case WasmTypes::I32:
            argOp = isImportCall ? Js::OpCodeAsmJs::ArgOut_Int : Js::OpCodeAsmJs::I_ArgOut_Int;
            break;
        case WasmTypes::I64:
            argOp = isImportCall ? Js::OpCodeAsmJs::ArgOut_Long : Js::OpCodeAsmJs::I_ArgOut_Long;
            break;
#ifdef ENABLE_WASM_SIMD
        case WasmTypes::V128:
            Simd::EnsureSimdIsEnabled();
            argOp = isImportCall ? Js::OpCodeAsmJs::Simd128_ArgOut_F4 : Js::OpCodeAsmJs::Simd128_I_ArgOut_F4;
            break;
#endif
        case WasmTypes::Any:
            // In unreachable mode allow any type as argument since we won't actually emit the call
            Assert(IsUnreachable());
            if (IsUnreachable())
            {
                argOp = Js::OpCodeAsmJs::ArgOut_Int;
                break;
            }
            // Fall through
        default:
            WasmTypes::CompileAssertCasesNoFailFast<WasmTypes::I32, WasmTypes::I64, WasmTypes::F32, WasmTypes::F64, WASM_V128_CHECK_TYPE>();
            throw WasmCompilationException(_u("Unknown argument type %u"), info.type);
        }

        m_writer->AsmReg2(argOp, argLoc, info.location);

        // Calculated next argument Js::Var location
        if (isImportCall)
        {
            ++argLoc;
        }
        else
        {
            const Js::ArgSlot currentArgSize = calleeSignature->GetParamSize(i);
            Assert(Math::IsAligned<Js::ArgSlot>(currentArgSize, sizeof(Js::Var)));
            argLoc += currentArgSize / sizeof(Js::Var);
        }
    }

    Js::RegSlot funcReg = GetRegisterSpace(WasmTypes::Ptr)->AcquireTmpRegister();

    // emit call
    switch (wasmOp)
    {
    case wbCall:
    {
        uint32 offset = isImportCall ? m_module->GetImportFuncOffset() : m_module->GetFuncOffset();
        uint32 index = UInt32Math::Add(offset, funcNum);
        m_writer->AsmSlot(Js::OpCodeAsmJs::LdSlot, funcReg, Js::AsmJsFunctionMemory::ModuleEnvRegister, index);
        break;
    }
    case wbCallIndirect:
    {
        Js::RegSlot slotReg = GetRegisterSpace(WasmTypes::Ptr)->AcquireTmpRegister();
        m_writer->AsmSlot(Js::OpCodeAsmJs::LdSlotArr, slotReg, Js::AsmJsFunctionMemory::ModuleEnvRegister, m_module->GetTableEnvironmentOffset());
        m_writer->AsmSlot(Js::OpCodeAsmJs::LdArr_WasmFunc, funcReg, slotReg, indirectIndexInfo.location);
        GetRegisterSpace(WasmTypes::Ptr)->ReleaseTmpRegister(slotReg);
        m_writer->AsmReg1IntConst1(Js::OpCodeAsmJs::CheckSignature, funcReg, calleeSignature->GetSignatureId());
        break;
    }
    default:
        Assume(UNREACHED);
    }

    // calculate number of RegSlots(Js::Var) the call consumes
    PolymorphicEmitInfo retInfo;
    retInfo.Init(calleeSignature->GetResultCount(), &m_alloc);
    for (uint32 i = 0; i < calleeSignature->GetResultCount(); ++i)
    {
        retInfo.SetInfo(EmitInfo(calleeSignature->GetResult(i)), i);
    }
    Js::ArgSlot args;
    if (isImportCall)
    {
        args = calleeSignature->GetParamCount();
        ArgSlotMath::Inc(args, argOverflow);

        Js::RegSlot varRetReg = GetRegisterSpace(WasmTypes::Ptr)->AcquireTmpRegister();
        AssertOrFailFastMsg(calleeSignature->GetResultCount() <= 1, "Multiple results from function imports not supported");
        WasmTypes::WasmType singleResType = calleeSignature->GetResultCount() > 0 ? calleeSignature->GetResult(0) : WasmTypes::Void;
        m_writer->AsmCall(Js::OpCodeAsmJs::Call, varRetReg, funcReg, args, WasmToAsmJs::GetAsmJsReturnType(singleResType), profileId);

        GetRegisterSpace(WasmTypes::Ptr)->ReleaseTmpRegister(varRetReg);
        GetRegisterSpace(WasmTypes::Ptr)->ReleaseTmpRegister(funcReg);

        ReleaseLocation(&indirectIndexInfo);
        //registers need to be released from higher ordinals to lower
        for (uint32 i = nArgs; i > 0; --i)
        {
            ReleaseLocation(&(argsList[i - 1]));
        }

        // emit result coercion
        if (calleeSignature->GetResultCount() > 0)
        {
            Js::OpCodeAsmJs convertOp = Js::OpCodeAsmJs::Nop;
            switch (singleResType)
            {
            case WasmTypes::F32:
                convertOp = Js::OpCodeAsmJs::Conv_VTF;
                break;
            case WasmTypes::F64:
                convertOp = Js::OpCodeAsmJs::Conv_VTD;
                break;
            case WasmTypes::I32:
                convertOp = Js::OpCodeAsmJs::Conv_VTI;
                break;
            case WasmTypes::I64:
                convertOp = Js::OpCodeAsmJs::Conv_VTL;
                break;
#ifdef ENABLE_WASM_SIMD
            case WasmTypes::V128:
                throw WasmCompilationException(_u("Return type: v128 not supported in import calls"));
#endif
            default:
                WasmTypes::CompileAssertCasesNoFailFast<WasmTypes::I32, WasmTypes::I64, WasmTypes::F32, WasmTypes::F64, WASM_V128_CHECK_TYPE>();
                throw WasmCompilationException(_u("Unknown call return type %u"), singleResType);
            }
            Js::RegSlot location = GetRegisterSpace(singleResType)->AcquireTmpRegister();
            retInfo.SetInfo(EmitInfo(location, singleResType), 0);
            m_writer->AsmReg2(convertOp, location, varRetReg);
        }
    }
    else
    {
        GetRegisterSpace(WasmTypes::Ptr)->ReleaseTmpRegister(funcReg);
        ReleaseLocation(&indirectIndexInfo);
        //registers need to be released from higher ordinals to lower
        for (uint32 i = nArgs; i > 0; --i)
        {
            ReleaseLocation(&(argsList[i - 1]));
        }

        for (uint32 i = 0; i < calleeSignature->GetResultCount(); ++i)
        {
            EmitInfo info(calleeSignature->GetResult(i));
            info.location = GetRegisterSpace(info.type)->AcquireTmpRegister();
            retInfo.SetInfo(info, i);
        }

        EmitInfo singleResultInfo = retInfo.Count() > 0 ? retInfo.GetInfo(0) : EmitInfo(WasmTypes::Void);
        args = (Js::ArgSlot)(::ceil((double)(argSize / sizeof(Js::Var))));
        // todo:: add bytecode to call and set aside multi results
        m_writer->AsmCall(Js::OpCodeAsmJs::I_Call, singleResultInfo.location, funcReg, args, WasmToAsmJs::GetAsmJsReturnType(singleResultInfo.type), profileId);
    }
    AdeleteArray(&m_alloc, nArgs, argsList);

    // WebAssemblyArrayBuffer is not detachable, no need to check for detached state here

    // track stack requirements for out params

    // + 1 for return address
    uint32 maxDepthForLevel = args + 1;
    if (maxDepthForLevel > m_maxArgOutDepth)
    {
        m_maxArgOutDepth = maxDepthForLevel;
    }

    return retInfo;
}